

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<int,3ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
          *result)

{
  bool bVar1;
  allocator local_d1;
  string local_d0;
  optional<std::array<int,_3UL>_> local_b0;
  undefined1 local_a0 [8];
  array<int,_3UL> value_1;
  char local_7d;
  undefined1 local_7c [7];
  char c;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  array<int,_3UL> value;
  vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
  *result_local;
  char sep_local;
  AsciiParser *this_local;
  
  ::std::
  vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
  ::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = MaybeNone(this);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<int,_3UL>_>::optional
                ((optional<std::array<int,_3UL>_> *)(value._M_elems + 2));
      ::std::
      vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
      ::push_back(result,(value_type *)(value._M_elems + 2));
      nonstd::optional_lite::optional<std::array<int,_3UL>_>::~optional
                ((optional<std::array<int,_3UL>_> *)(value._M_elems + 2));
    }
    else {
      bVar1 = ParseBasicTypeTuple<int,3ul>(this,(array<int,_3UL> *)local_48);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_68,"Not starting with the tuple value of requested type.\n",
                   &local_69);
        PushError(this,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
        return false;
      }
      nonstd::optional_lite::optional<std::array<int,_3UL>_>::optional<std::array<int,_3UL>_&,_0>
                ((optional<std::array<int,_3UL>_> *)local_7c,(array<int,_3UL> *)local_48);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
      ::push_back(result,(value_type *)local_7c);
      nonstd::optional_lite::optional<std::array<int,_3UL>_>::~optional
                ((optional<std::array<int,_3UL>_> *)local_7c);
    }
    while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_7d);
      if (!bVar1) {
        return false;
      }
      if (local_7d != sep) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        nonstd::optional_lite::optional<std::array<int,_3UL>_>::optional
                  ((optional<std::array<int,_3UL>_> *)(value_1._M_elems + 2));
        ::std::
        vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
        ::push_back(result,(value_type *)(value_1._M_elems + 2));
        nonstd::optional_lite::optional<std::array<int,_3UL>_>::~optional
                  ((optional<std::array<int,_3UL>_> *)(value_1._M_elems + 2));
      }
      else {
        bVar1 = ParseBasicTypeTuple<int,3ul>(this,(array<int,_3UL> *)local_a0);
        if (!bVar1) break;
        nonstd::optional_lite::optional<std::array<int,_3UL>_>::optional<std::array<int,_3UL>_&,_0>
                  (&local_b0,(array<int,_3UL> *)local_a0);
        ::std::
        vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
        ::push_back(result,&local_b0);
        nonstd::optional_lite::optional<std::array<int,_3UL>_>::~optional(&local_b0);
      }
    }
    bVar1 = ::std::
            vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
            ::empty(result);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_d0,"Empty array.\n",&local_d1);
      PushError(this,&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}